

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_xar.c
# Opt level: O2

void verify7(archive *a,archive_entry *ae)

{
  mode_t mVar1;
  la_int64_t lVar2;
  char *pcVar3;
  time_t v1;
  
  mVar1 = archive_entry_filetype(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                   ,L'Ƭ',(uint)(mVar1 == 0x8000),"archive_entry_filetype(ae) == AE_IFREG",
                   (void *)0x0);
  mVar1 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'ƭ',(ulong)(mVar1 & 0x1ff),"archive_entry_mode(ae) & 0777",0x1a4,"0644",
                      (void *)0x0);
  lVar2 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'Ʈ',lVar2,"archive_entry_uid(ae)",0x3e9,"UID",(void *)0x0);
  lVar2 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'Ư',lVar2,"archive_entry_gid(ae)",0x3e9,"GID",(void *)0x0);
  pcVar3 = archive_entry_uname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
             ,L'ư',pcVar3,"archive_entry_uname(ae)","cue","UNAME",(void *)0x0,L'\0');
  pcVar3 = archive_entry_gname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
             ,L'Ʊ',pcVar3,"archive_entry_gname(ae)","cue","GNAME",(void *)0x0,L'\0');
  pcVar3 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
             ,L'Ʋ',pcVar3,"archive_entry_pathname(ae)","dir1/f1","\"dir1/f1\"",(void *)0x0,L'\0');
  pcVar3 = archive_entry_hardlink(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                   ,L'Ƴ',(uint)(pcVar3 == (char *)0x0),"archive_entry_hardlink(ae) == NULL",
                   (void *)0x0);
  pcVar3 = archive_entry_symlink(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                   ,L'ƴ',(uint)(pcVar3 == (char *)0x0),"archive_entry_symlink(ae) == NULL",
                   (void *)0x0);
  v1 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_xar.c"
                      ,L'Ƶ',v1,"archive_entry_mtime(ae)",0x15181,"86401",(void *)0x0);
  return;
}

Assistant:

static void verify7(struct archive *a, struct archive_entry *ae)
{
	(void)a; /* UNUSED */
	assert(archive_entry_filetype(ae) == AE_IFREG);
	assertEqualInt(archive_entry_mode(ae) & 0777, 0644);
	assertEqualInt(archive_entry_uid(ae), UID);
	assertEqualInt(archive_entry_gid(ae), GID);
	assertEqualString(archive_entry_uname(ae), UNAME);
	assertEqualString(archive_entry_gname(ae), GNAME);
	assertEqualString(archive_entry_pathname(ae), "dir1/f1");
	assert(archive_entry_hardlink(ae) == NULL);
	assert(archive_entry_symlink(ae) == NULL);
	assertEqualInt(archive_entry_mtime(ae), 86401);
}